

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hacdManifoldMesh.cpp
# Opt level: O3

void __thiscall HACD::TMMesh::Print(TMMesh *this)

{
  CircularListElement<HACD::TMMVertex> *pCVar1;
  ostream *poVar2;
  size_t sVar3;
  
  sVar3 = (this->m_vertices).m_size;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"-----------------------------",0x1d);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x20);
  std::ostream::put(-0x20);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vertices (",10);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,")",1);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  for (; sVar3 != 0; sVar3 = sVar3 - 1) {
    pCVar1 = (this->m_vertices).m_head;
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,", ",2);
    poVar2 = std::ostream::_M_insert<double>((pCVar1->m_data).m_pos.m_data[0]);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,", ",2);
    poVar2 = std::ostream::_M_insert<double>((pCVar1->m_data).m_pos.m_data[1]);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,", ",2);
    poVar2 = std::ostream::_M_insert<double>((pCVar1->m_data).m_pos.m_data[2]);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    if ((this->m_vertices).m_size != 0) {
      (this->m_vertices).m_head = ((this->m_vertices).m_head)->m_next;
    }
  }
  sVar3 = (this->m_edges).m_size;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"edges (",7);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,")",1);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  for (; sVar3 != 0; sVar3 = sVar3 - 1) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"-> (",4);
    poVar2 = std::ostream::_M_insert<long>((long)&std::cout);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,", ",2);
    poVar2 = std::ostream::_M_insert<long>((long)poVar2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,")",1);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"-> F0 (",7);
    poVar2 = std::ostream::_M_insert<long>((long)&std::cout);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,", ",2);
    poVar2 = std::ostream::_M_insert<long>((long)poVar2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,", ",2);
    poVar2 = std::ostream::_M_insert<long>((long)poVar2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,")",1);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"-> F1 (",7);
    poVar2 = std::ostream::_M_insert<long>((long)&std::cout);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,", ",2);
    poVar2 = std::ostream::_M_insert<long>((long)poVar2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,", ",2);
    poVar2 = std::ostream::_M_insert<long>((long)poVar2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,")",1);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    if ((this->m_edges).m_size != 0) {
      (this->m_edges).m_head = ((this->m_edges).m_head)->m_next;
    }
  }
  sVar3 = (this->m_triangles).m_size;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"triangles (",0xb);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,")",1);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  for (; sVar3 != 0; sVar3 = sVar3 - 1) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"-> (",4);
    poVar2 = std::ostream::_M_insert<long>((long)&std::cout);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,", ",2);
    poVar2 = std::ostream::_M_insert<long>((long)poVar2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,", ",2);
    poVar2 = std::ostream::_M_insert<long>((long)poVar2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,")",1);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"-> E0 (",7);
    poVar2 = std::ostream::_M_insert<long>((long)&std::cout);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,", ",2);
    poVar2 = std::ostream::_M_insert<long>((long)poVar2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,")",1);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"-> E1 (",7);
    poVar2 = std::ostream::_M_insert<long>((long)&std::cout);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,", ",2);
    poVar2 = std::ostream::_M_insert<long>((long)poVar2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,")",1);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"-> E2 (",7);
    poVar2 = std::ostream::_M_insert<long>((long)&std::cout);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,", ",2);
    poVar2 = std::ostream::_M_insert<long>((long)poVar2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,")",1);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    if ((this->m_triangles).m_size != 0) {
      (this->m_triangles).m_head = ((this->m_triangles).m_head)->m_next;
    }
  }
  return;
}

Assistant:

void TMMesh::Print() 
	{
		size_t nV = m_vertices.GetSize();
		std::cout << "-----------------------------" << std::endl;
        std::cout << "vertices (" << nV << ")" << std::endl;
        for(size_t v = 0; v < nV; v++)
		{
			const TMMVertex & currentVertex = m_vertices.GetData();
			std::cout  << currentVertex.m_id	  << ", " 
		 			   << currentVertex.m_pos.X() << ", " 
					   << currentVertex.m_pos.Y() << ", "
					   << currentVertex.m_pos.Z() << std::endl;
			m_vertices.Next();
		}
    

		size_t nE = m_edges.GetSize();
		std::cout << "edges (" << nE << ")" << std::endl;
		for(size_t e = 0; e < nE; e++)
		{
			const TMMEdge & currentEdge = m_edges.GetData();
            const CircularListElement<TMMVertex> * v0 = currentEdge.m_vertices[0];
            const CircularListElement<TMMVertex> * v1 = currentEdge.m_vertices[1];
            const CircularListElement<TMMTriangle> * f0 = currentEdge.m_triangles[0];
            const CircularListElement<TMMTriangle> * f1 = currentEdge.m_triangles[1];

			std::cout << "-> (" << v0->GetData().m_name << ", " << v1->GetData().m_name << ")" << std::endl; 
            std::cout << "-> F0 (" << f0->GetData().m_vertices[0]->GetData().m_name << ", " 
                                   << f0->GetData().m_vertices[1]->GetData().m_name << ", "
                                   << f0->GetData().m_vertices[2]->GetData().m_name <<")" << std::endl; 
            std::cout << "-> F1 (" << f1->GetData().m_vertices[0]->GetData().m_name << ", " 
                                   << f1->GetData().m_vertices[1]->GetData().m_name << ", "
                                   << f1->GetData().m_vertices[2]->GetData().m_name << ")" << std::endl;                         
			m_edges.Next();
		}
		size_t nT = m_triangles.GetSize();
		std::cout << "triangles (" << nT << ")" << std::endl;
		for(size_t t = 0; t < nT; t++)
		{
			const TMMTriangle & currentTriangle = m_triangles.GetData();
            const CircularListElement<TMMVertex> * v0 = currentTriangle.m_vertices[0];
            const CircularListElement<TMMVertex> * v1 = currentTriangle.m_vertices[1];
            const CircularListElement<TMMVertex> * v2 = currentTriangle.m_vertices[2];
            const CircularListElement<TMMEdge> * e0 = currentTriangle.m_edges[0];
            const CircularListElement<TMMEdge> * e1 = currentTriangle.m_edges[1];
            const CircularListElement<TMMEdge> * e2 = currentTriangle.m_edges[2];
            
			std::cout << "-> (" << v0->GetData().m_name << ", " << v1->GetData().m_name << ", "<< v2->GetData().m_name << ")" << std::endl; 
         
            std::cout << "-> E0 (" << e0->GetData().m_vertices[0]->GetData().m_name << ", " 
                                   << e0->GetData().m_vertices[1]->GetData().m_name << ")" << std::endl; 
            std::cout << "-> E1 (" << e1->GetData().m_vertices[0]->GetData().m_name << ", " 
                                   << e1->GetData().m_vertices[1]->GetData().m_name << ")" << std::endl;
            std::cout << "-> E2 (" << e2->GetData().m_vertices[0]->GetData().m_name << ", " 
                                   << e2->GetData().m_vertices[1]->GetData().m_name << ")" << std::endl;   
			m_triangles.Next();
		}   
	}